

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_md5.cpp
# Opt level: O3

bool ON_MD5::Validate(void)

{
  bool bVar1;
  ON__UINT32 OVar2;
  ON__UINT64 sizeof_buffer;
  ulong uVar3;
  ulong uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  ON_MD5_Hash OVar7;
  ON_MD5_Hash md5_digest;
  ON__UINT8 a [200];
  ON_RandomNumberGenerator rng;
  ON_MD5_Hash md5_digestx;
  ON__UINT8 local_b68;
  ON__UINT8 OStack_b67;
  ON__UINT8 OStack_b66;
  ON__UINT8 OStack_b65;
  ON__UINT8 OStack_b64;
  ON__UINT8 OStack_b63;
  ON__UINT8 OStack_b62;
  ON__UINT8 OStack_b61;
  ON__UINT8 OStack_b60;
  ON__UINT8 OStack_b5f;
  ON__UINT8 OStack_b5e;
  ON__UINT8 OStack_b5d;
  ON__UINT8 OStack_b5c;
  ON__UINT8 OStack_b5b;
  ON__UINT8 OStack_b5a;
  ON__UINT8 OStack_b59;
  undefined1 local_b58 [16];
  undefined1 local_b48 [16];
  undefined1 local_b38 [16];
  undefined1 local_b28 [16];
  undefined1 local_b18 [16];
  undefined1 local_b08 [16];
  ON__UINT32 local_af8 [2];
  ON_MD5_Hash local_af0;
  undefined1 local_ad8 [212];
  ON_RandomNumberGenerator local_a04;
  
  bVar1 = MD5_ValidateHelper("",&DAT_006c2350);
  if ((((bVar1) &&
       (auVar5[0] = -(ON_MD5_Hash::EmptyContentHash.m_digest[0] == 0xd4),
       auVar5[1] = -(ON_MD5_Hash::EmptyContentHash.m_digest[1] == '\x1d'),
       auVar5[2] = -(ON_MD5_Hash::EmptyContentHash.m_digest[2] == 0x8c),
       auVar5[3] = -(ON_MD5_Hash::EmptyContentHash.m_digest[3] == 0xd9),
       auVar5[4] = -(ON_MD5_Hash::EmptyContentHash.m_digest[4] == 0x8f),
       auVar5[5] = -(ON_MD5_Hash::EmptyContentHash.m_digest[5] == '\0'),
       auVar5[6] = -(ON_MD5_Hash::EmptyContentHash.m_digest[6] == 0xb2),
       auVar5[7] = -(ON_MD5_Hash::EmptyContentHash.m_digest[7] == '\x04'),
       auVar5[8] = -(ON_MD5_Hash::EmptyContentHash.m_digest[8] == 0xe9),
       auVar5[9] = -(ON_MD5_Hash::EmptyContentHash.m_digest[9] == 0x80),
       auVar5[10] = -(ON_MD5_Hash::EmptyContentHash.m_digest[10] == '\t'),
       auVar5[0xb] = -(ON_MD5_Hash::EmptyContentHash.m_digest[0xb] == 0x98),
       auVar5[0xc] = -(ON_MD5_Hash::EmptyContentHash.m_digest[0xc] == 0xec),
       auVar5[0xd] = -(ON_MD5_Hash::EmptyContentHash.m_digest[0xd] == 0xf8),
       auVar5[0xe] = -(ON_MD5_Hash::EmptyContentHash.m_digest[0xe] == 'B'),
       auVar5[0xf] = -(ON_MD5_Hash::EmptyContentHash.m_digest[0xf] == '~'),
       (ushort)((ushort)(SUB161(auVar5 >> 7,0) & 1) | (ushort)(SUB161(auVar5 >> 0xf,0) & 1) << 1 |
                (ushort)(SUB161(auVar5 >> 0x17,0) & 1) << 2 |
                (ushort)(SUB161(auVar5 >> 0x1f,0) & 1) << 3 |
                (ushort)(SUB161(auVar5 >> 0x27,0) & 1) << 4 |
                (ushort)(SUB161(auVar5 >> 0x2f,0) & 1) << 5 |
                (ushort)(SUB161(auVar5 >> 0x37,0) & 1) << 6 |
                (ushort)(SUB161(auVar5 >> 0x3f,0) & 1) << 7 |
                (ushort)(SUB161(auVar5 >> 0x47,0) & 1) << 8 |
                (ushort)(SUB161(auVar5 >> 0x4f,0) & 1) << 9 |
                (ushort)(SUB161(auVar5 >> 0x57,0) & 1) << 10 |
                (ushort)(SUB161(auVar5 >> 0x5f,0) & 1) << 0xb |
                (ushort)(SUB161(auVar5 >> 0x67,0) & 1) << 0xc |
                (ushort)(SUB161(auVar5 >> 0x6f,0) & 1) << 0xd |
                (ushort)(SUB161(auVar5 >> 0x77,0) & 1) << 0xe | (ushort)(auVar5[0xf] >> 7) << 0xf)
       == 0xffff)) && (bVar1 = MD5_ValidateHelper("abc",&DAT_006c2370), bVar1)) &&
     (((bVar1 = MD5_ValidateHelper("abcdbcdecdefdefgefghfghighijhijkijkljklmklmnlmnomnopnopq",
                                   &DAT_006c2380), bVar1 &&
       (bVar1 = MD5_ValidateHelper("The quick brown fox jumps over the lazy dog",&DAT_006c2390),
       bVar1)) &&
      (bVar1 = MD5_ValidateHelper("The quick brown fox jumps over the lazy dog.",&DAT_006c23a0),
      bVar1)))) {
    memset(local_ad8,0x61,200);
    local_b08 = (undefined1  [16])0x0;
    local_b18 = (undefined1  [16])0x0;
    local_b28 = (undefined1  [16])0x0;
    local_b38 = (undefined1  [16])0x0;
    local_b48 = (undefined1  [16])0x0;
    local_b58 = (undefined1  [16])0x0;
    local_af8[0] = 0;
    local_af8[1] = 0;
    ON_MD5_Hash::ON_MD5_Hash(&local_af0);
    uVar3 = 0;
    do {
      if (999999 < uVar3) {
        OVar7 = Hash((ON_MD5 *)local_b58);
        local_b68 = OVar7.m_digest[0];
        OStack_b67 = OVar7.m_digest[1];
        OStack_b66 = OVar7.m_digest[2];
        OStack_b65 = OVar7.m_digest[3];
        OStack_b64 = OVar7.m_digest[4];
        OStack_b63 = OVar7.m_digest[5];
        OStack_b62 = OVar7.m_digest[6];
        OStack_b61 = OVar7.m_digest[7];
        OStack_b60 = OVar7.m_digest[8];
        OStack_b5f = OVar7.m_digest[9];
        OStack_b5e = OVar7.m_digest[10];
        OStack_b5d = OVar7.m_digest[0xb];
        OStack_b5c = OVar7.m_digest[0xc];
        OStack_b5b = OVar7.m_digest[0xd];
        OStack_b5a = OVar7.m_digest[0xe];
        OStack_b59 = OVar7.m_digest[0xf];
        auVar6[0] = -(local_b68 == 'w');
        auVar6[1] = -(OStack_b67 == '\a');
        auVar6[2] = -(OStack_b66 == 0xd6);
        auVar6[3] = -(OStack_b65 == 0xae);
        auVar6[4] = -(OStack_b64 == 'N');
        auVar6[5] = -(OStack_b63 == '\x02');
        auVar6[6] = -(OStack_b62 == '|');
        auVar6[7] = -(OStack_b61 == 'p');
        auVar6[8] = -(OStack_b60 == 0xee);
        auVar6[9] = -(OStack_b5f == 0xa2);
        auVar6[10] = -(OStack_b5e == 0xa9);
        auVar6[0xb] = -(OStack_b5d == '5');
        auVar6[0xc] = -(OStack_b5c == 0xc2);
        auVar6[0xd] = -(OStack_b5b == ')');
        auVar6[0xe] = -(OStack_b5a == 'o');
        auVar6[0xf] = -(OStack_b59 == '!');
        if ((ushort)((ushort)(SUB161(auVar6 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar6 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar6 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar6 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar6 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar6 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar6 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar6 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar6 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar6 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar6 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar6 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar6 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar6 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar6 >> 0x77,0) & 1) << 0xe |
                    (ushort)(auVar6[0xf] >> 7) << 0xf) != 0xffff) {
          return false;
        }
        local_b08 = ZEXT816(0xefcdab8967452301) << 0x40;
        local_af8[0] = 0x98badcfe;
        local_af8[1] = 0x10325476;
        local_b58._0_12_ = ZEXT412(1) << 0x40;
        ON_RandomNumberGenerator::ON_RandomNumberGenerator(&local_a04);
        uVar3 = 0;
        do {
          if (999999 < uVar3) {
            OVar7 = Hash((ON_MD5 *)local_b58);
            return OVar7.m_digest._0_8_ == 0x707c024eaed60777 &&
                   OVar7.m_digest._8_8_ == 0x216f29c235a9a2ee;
          }
          OVar2 = ON_RandomNumberGenerator::RandomNumber(&local_a04);
          sizeof_buffer = 1000000 - uVar3;
          if (OVar2 % 100 + uVar3 + 100 < 0xf4241) {
            sizeof_buffer = (ulong)(OVar2 % 100) + 100;
          }
          AccumulateBytes((ON_MD5 *)local_b58,local_ad8,sizeof_buffer);
          uVar3 = uVar3 + sizeof_buffer;
        } while (local_b58._0_8_ == uVar3);
        return false;
      }
      AccumulateBytes((ON_MD5 *)local_b58,local_ad8,200);
      uVar4 = uVar3 + 200;
      uVar3 = local_b58._0_8_;
    } while (local_b58._0_8_ == uVar4);
  }
  return false;
}

Assistant:

bool ON_MD5::Validate()
{
  // http://onlinemd5.com/

  // "" (empty string)
  // d41d8cd9 8f00b204 e9800998 ecf8427e
  const ON__UINT8 empty_string[16] = {
    0xd4, 0x1d, 0x8c, 0xd9,
    0x8f, 0x00, 0xb2, 0x04,
    0xe9, 0x80, 0x09, 0x98,
    0xec, 0xf8, 0x42, 0x7e };
  if (false == MD5_ValidateHelper("",empty_string))
    return false;

  
  if (0 != memcmp(&ON_MD5_Hash::EmptyContentHash ,empty_string, sizeof(empty_string)))
    return false;

  // "abc"
  // 90015098 3CD24FB0 D6963F7D 28E17F72
  const ON__UINT8 abc[16]  = { 
    0x90, 0x01, 0x50, 0x98,
    0x3C, 0xD2, 0x4F, 0xB0,
    0xD6, 0x96, 0x3F, 0x7D,
    0x28, 0xE1, 0x7F, 0x72  };
  if (false == MD5_ValidateHelper("abc",abc))
    return false;

  // "abcdbcdecdefdefgefghfghighijhijkijkljklmklmnlmnomnopnopq"
  // 8215EF07 96A20BCA AAE116D3 876C664A
  const ON__UINT8 abc_x[16] = { 
    0x82, 0x15, 0xEF, 0x07,
    0x96, 0xA2, 0x0B, 0xCA,
    0xAA, 0xE1, 0x16, 0xD3,
    0x87, 0x6C, 0x66, 0x4A };
  if (false == MD5_ValidateHelper("abcdbcdecdefdefgefghfghighijhijkijkljklmklmnlmnomnopnopq",abc_x))
    return false;

  // "The quick brown fox jumps over the lazy dog"
  // 9E107D9D 372BB682 6BD81D35 42A419D6
  const ON__UINT8 quickfox[16] = {
    0x9E, 0x10, 0x7D, 0x9D,
    0x37, 0x2B, 0xB6, 0x82,
    0x6B, 0xD8, 0x1D, 0x35,
    0x42, 0xA4, 0x19, 0xD6 };
  if (false == MD5_ValidateHelper("The quick brown fox jumps over the lazy dog",quickfox))
    return false;

  // "The quick brown fox jumps over the lazy dog."
  // E4D909C2 90D0FB1C A068FFAD DF22CBD0
  const ON__UINT8 quickfoxperiod[16] = {
    0xE4, 0xD9, 0x09, 0xC2,
    0x90, 0xD0, 0xFB, 0x1C,
    0xA0, 0x68, 0xFF, 0xAD,
    0xDF, 0x22, 0xCB, 0xD0 };
  if (false == MD5_ValidateHelper("The quick brown fox jumps over the lazy dog.",quickfoxperiod))
    return false;

  // 1,000,000 repetitions of the character "a".
  // 7707D6AE 4E027C70 EEA2A935 C2296F21.
  const ON__UINT8 millionXa[16] = {
    0x77, 0x07, 0xD6, 0xAE,
    0x4E, 0x02, 0x7C, 0x70,
    0xEE, 0xA2, 0xA9, 0x35,
    0xC2, 0x29, 0x6F, 0x21 };

  const size_t one_million = 1000000;
  ON__UINT8 a[200];
  const size_t a_count = sizeof(a) / sizeof(a[0]);
  for ( size_t i = 0; i < a_count; i++)
    a[i] = 'a';  
  ON_MD5 md5;
  size_t total_count = 0;
  for (total_count = 0; total_count < one_million; total_count += a_count)
  {
    md5.AccumulateBytes(a, a_count);
    if (md5.ByteCount() != (ON__UINT64)(total_count+a_count))
      return false;
  }
  
  ON_MD5_Hash md5_digest(md5.Hash());

  if (0 != memcmp(&md5_digest,millionXa,sizeof(millionXa)))
    return false;

  md5.Reset();
  ON_RandomNumberGenerator rng;
  total_count = 0; 
  const size_t min_count = (a_count >= 10000) ? a_count/1000 : 100;
  while (total_count < one_million)
  {
    size_t count = min_count + (rng.RandomNumber() % (ON__UINT32)min_count);
    if ( total_count + count > one_million )
      count = one_million - total_count;
    md5.AccumulateBytes(a, count);
    total_count += count;
    if (md5.ByteCount() != (ON__UINT64)total_count)
      return false;
  }

  ON_MD5_Hash md5_digestx(md5.Hash());
  if (0 != memcmp(&md5_digestx,millionXa,sizeof(millionXa)))
    return false;


  return true;
}